

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
          (cmOrderDirectoriesConstraint *this,cmOrderDirectories *od,string *file)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  difference_type __n;
  ulong uVar4;
  bool bVar5;
  string local_128;
  string local_108;
  allocator<char> local_e1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_c0 [32];
  string local_a0;
  byte local_79;
  string local_78;
  byte local_51;
  string local_50;
  string *local_20;
  string *file_local;
  cmOrderDirectories *od_local;
  cmOrderDirectoriesConstraint *this_local;
  
  this->_vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraint_00a241f0;
  this->OD = od;
  this->GlobalGenerator = od->GlobalGenerator;
  local_20 = file;
  file_local = (string *)od;
  od_local = (cmOrderDirectories *)this;
  std::__cxx11::string::string((string *)&this->FullPath);
  std::__cxx11::string::string((string *)&this->Directory);
  std::__cxx11::string::string((string *)&this->FileName);
  std::__cxx11::string::operator=((string *)&this->FullPath,(string *)local_20);
  lVar3 = std::__cxx11::string::rfind((char *)local_20,0x80690d);
  if (lVar3 != -1) {
    if ((cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)::
         splitFramework == '\0') &&
       (iVar2 = __cxa_guard_acquire(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                                     ::splitFramework), iVar2 != 0)) {
      cmsys::RegularExpression::RegularExpression
                (&cmOrderDirectoriesConstraint::splitFramework,"^(.*)/(.*).framework/(.*)$");
      __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                   &cmOrderDirectoriesConstraint::splitFramework,&__dso_handle);
      __cxa_guard_release(&cmOrderDirectoriesConstraint(cmOrderDirectories*,std::__cxx11::string_const&)
                           ::splitFramework);
    }
    local_51 = 0;
    local_79 = 0;
    bVar1 = cmsys::RegularExpression::find(&cmOrderDirectoriesConstraint::splitFramework,local_20);
    bVar5 = false;
    if (bVar1) {
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_50,&cmOrderDirectoriesConstraint::splitFramework,3);
      local_51 = 1;
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_78,&cmOrderDirectoriesConstraint::splitFramework,2);
      local_79 = 1;
      lVar3 = std::__cxx11::string::find((string *)&local_50,(ulong)&local_78);
      bVar5 = lVar3 != -1;
    }
    if ((local_79 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    if ((local_51 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (bVar5) {
      cmsys::RegularExpression::match_abi_cxx11_
                (&local_a0,&cmOrderDirectoriesConstraint::splitFramework,1);
      std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      local_d8._M_current = (char *)std::__cxx11::string::begin();
      __n = std::__cxx11::string::size();
      local_d0 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_d8,__n);
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_d0,1);
      local_e0._M_current = (char *)std::__cxx11::string::end();
      std::allocator<char>::allocator();
      std::__cxx11::string::
      string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (local_c0,local_c8,local_e0,&local_e1);
      std::__cxx11::string::operator=((string *)&this->FileName,local_c0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_e1);
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    cmsys::SystemTools::GetFilenamePath(&local_108,local_20);
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    cmsys::SystemTools::GetFilenameName(&local_128,local_20);
    std::__cxx11::string::operator=((string *)&this->FileName,(string *)&local_128);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraint(cmOrderDirectories* od, std::string const& file)
    : OD(od)
    , GlobalGenerator(od->GlobalGenerator)
  {
    this->FullPath = file;

    if (file.rfind(".framework") != std::string::npos) {
      static cmsys::RegularExpression splitFramework(
        "^(.*)/(.*).framework/(.*)$");
      if (splitFramework.find(file) &&
          (std::string::npos !=
           splitFramework.match(3).find(splitFramework.match(2)))) {
        this->Directory = splitFramework.match(1);
        this->FileName =
          std::string(file.begin() + this->Directory.size() + 1, file.end());
      }
    }

    if (this->FileName.empty()) {
      this->Directory = cmSystemTools::GetFilenamePath(file);
      this->FileName = cmSystemTools::GetFilenameName(file);
    }
  }